

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O3

lws_protocol_vhost_options * lws_vhost_protocol_options(lws_vhost *vh,char *name)

{
  int iVar1;
  lws_protocol_vhost_options *plVar2;
  
  if (name == (char *)0x0) {
LAB_001125c6:
    plVar2 = (lws_protocol_vhost_options *)0x0;
  }
  else {
    plVar2 = (lws_protocol_vhost_options *)&vh->pvo;
    do {
      plVar2 = plVar2->next;
      if (plVar2 == (lws_protocol_vhost_options *)0x0) goto LAB_001125c6;
      iVar1 = strcmp(plVar2->name,name);
    } while (iVar1 != 0);
  }
  return plVar2;
}

Assistant:

const struct lws_protocol_vhost_options *
lws_vhost_protocol_options(struct lws_vhost *vh, const char *name)
{
	const struct lws_protocol_vhost_options *pvo = vh->pvo;

	if (!name)
		return NULL;

	while (pvo) {
		if (!strcmp(pvo->name, name))
			return pvo;
		pvo = pvo->next;
	}

	return NULL;
}